

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O2

string * __thiscall
libcalc::t2s_abi_cxx11_
          (string *__return_storage_ptr__,libcalc *this,
          vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *tokens)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(undefined8 **)(this + 8);
  for (puVar2 = *(undefined8 **)this; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar2," ")
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::erase
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
  return __return_storage_ptr__;
}

Assistant:

std::string t2s(std::vector<Token *> tokens) {
  std::string out;

  for (Token *t : tokens) {
    out += t->value + " ";
  }

  out.erase(out.length() - 1);

  return out;
}